

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Gia_ManEvalWindow(Gia_Man_t *p,Vec_Int_t *vLeaves,Vec_Int_t *vNodes,Vec_Wec_t *vWin,
                     Vec_Int_t *vTemp,int fUseTwo)

{
  int iVar1;
  int iVar2;
  int DelayMax;
  int fUseTwo_local;
  Vec_Int_t *vTemp_local;
  Vec_Wec_t *vWin_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vLeaves_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vNodes);
  iVar2 = Vec_WecSize(vWin);
  if (iVar1 == iVar2) {
    Gia_ManUpdateMapping(p,vNodes,vWin);
    iVar1 = Gia_ManComputeEdgeDelay(p,fUseTwo);
    Gia_ManUpdateMapping(p,vNodes,vWin);
    return iVar1;
  }
  __assert_fail("Vec_IntSize(vNodes) == Vec_WecSize(vWin)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                ,0x27c,
                "int Gia_ManEvalWindow(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, int)"
               );
}

Assistant:

int Gia_ManEvalWindow( Gia_Man_t * p, Vec_Int_t * vLeaves, Vec_Int_t * vNodes, Vec_Wec_t * vWin, Vec_Int_t * vTemp, int fUseTwo )
{
    int DelayMax;
    assert( Vec_IntSize(vNodes) == Vec_WecSize(vWin) );
    Gia_ManUpdateMapping( p, vNodes, vWin );
    DelayMax = Gia_ManComputeEdgeDelay( p, fUseTwo );
    Gia_ManUpdateMapping( p, vNodes, vWin );
    return DelayMax;
}